

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void w_cb(Fl_Value_Input *i,void *v)

{
  Fl_Window *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Window *pFVar8;
  Fl_Type *pFVar9;
  
  if ((char *)v == "LOAD") {
    w_input = i;
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if (iVar4 != 0) {
      Fl_Valuator::value(&i->super_Fl_Valuator,(double)current_widget->o->w_);
      Fl_Widget::activate((Fl_Widget *)w_input);
      return;
    }
    Fl_Widget::deactivate((Fl_Widget *)w_input);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar1 = false;
    pFVar9 = Fl_Type::first;
    do {
      if (pFVar9->selected != '\0') {
        iVar4 = (*pFVar9->_vptr_Fl_Type[0x17])(pFVar9);
        if (iVar4 != 0) {
          this = (Fl_Window *)pFVar9[1].prev;
          (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                    (this,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
                     (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
                     (ulong)(uint)(int)(i->super_Fl_Valuator).value_,
                     (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
          pFVar8 = Fl_Widget::window((Fl_Widget *)this);
          if (pFVar8 != (Fl_Window *)0x0) {
            pFVar8 = Fl_Widget::window((Fl_Widget *)this);
            Fl_Widget::redraw((Fl_Widget *)pFVar8);
          }
          iVar5 = (*pFVar9->_vptr_Fl_Type[0x21])(pFVar9);
          iVar2 = gridy;
          iVar4 = gridx;
          bVar1 = true;
          if (iVar5 != 0) {
            iVar6 = Fl::w();
            iVar7 = Fl::h();
            iVar3 = gridy;
            iVar5 = gridx;
            this->minw = iVar4;
            this->minh = iVar2;
            this->maxw = iVar6;
            this->maxh = iVar7;
            this->dw = iVar5;
            this->dh = iVar3;
            this->aspect = 0;
            Fl_Window::size_range_(this);
          }
        }
      }
      pFVar9 = pFVar9->next;
    } while (pFVar9 != (Fl_Type *)0x0);
    if (bVar1) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void w_cb(Fl_Value_Input *i, void *v) {
  if (v == LOAD) {
    w_input = i;
    if (current_widget->is_widget()) {
      i->value(((Fl_Widget_Type *)current_widget)->o->w());
      w_input->activate();
    } else w_input->deactivate();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        Fl_Widget *w = ((Fl_Widget_Type *)o)->o;
	w->resize(w->x(), w->y(), (int)i->value(), w->h());
	if (w->window()) w->window()->redraw();
	if (o->is_window()) {
          ((Fl_Window *)w)->size_range(gridx, gridy, Fl::w(), Fl::h(),
                                       gridx, gridy, 0);
	}
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}